

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Scene *pSVar7;
  Ref<embree::Geometry> *pRVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  uint uVar59;
  AABBNodeMB4D *node1;
  ulong uVar60;
  ulong uVar61;
  long lVar62;
  int iVar63;
  long lVar64;
  ulong uVar65;
  ulong uVar66;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong *puVar72;
  ulong uVar73;
  long lVar74;
  ulong uVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  ulong uVar82;
  long lVar83;
  bool bVar84;
  bool bVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar114;
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar118 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  float fVar131;
  float fVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar144;
  float fVar146;
  float fVar148;
  undefined1 auVar135 [32];
  float fVar137;
  float fVar139;
  float fVar143;
  float fVar145;
  float fVar147;
  undefined1 auVar136 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  float fVar156;
  float fVar157;
  undefined1 auVar153 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [32];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar174 [32];
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar181 [16];
  float fVar186;
  float fVar187;
  float fVar188;
  undefined1 auVar182 [32];
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar189 [16];
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar190 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 *local_18b0;
  ulong local_18a8;
  ulong local_18a0;
  ulong local_1898;
  long local_1890;
  ulong *local_1888;
  undefined1 local_1880 [32];
  RTCFilterFunctionNArguments local_1850;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  float local_1800;
  float fStack_17fc;
  float fStack_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  float fStack_17e8;
  float fStack_17e4;
  float local_17e0;
  float fStack_17dc;
  float fStack_17d8;
  float fStack_17d4;
  float fStack_17d0;
  float fStack_17cc;
  float fStack_17c8;
  float fStack_17c4;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float fStack_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  float local_1780;
  float fStack_177c;
  float fStack_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float fStack_1768;
  float fStack_1764;
  undefined1 local_1760 [32];
  undefined1 local_1740 [32];
  undefined1 local_1720 [32];
  undefined1 local_1700 [32];
  undefined1 local_16e0 [32];
  undefined1 local_16c0 [32];
  undefined1 local_16a0 [32];
  undefined1 local_1680 [32];
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float fStack_1608;
  float fStack_1604;
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1530 [16];
  undefined1 local_1520 [16];
  undefined1 local_1510 [16];
  undefined1 local_1500 [16];
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [16];
  RTCHitN local_14d0 [16];
  undefined4 local_14c0;
  undefined4 uStack_14bc;
  undefined4 uStack_14b8;
  undefined4 uStack_14b4;
  undefined4 local_14b0;
  undefined4 uStack_14ac;
  undefined4 uStack_14a8;
  undefined4 uStack_14a4;
  undefined1 local_14a0 [16];
  undefined1 local_1490 [16];
  undefined1 local_1480 [16];
  undefined1 local_1470 [16];
  uint local_1460;
  uint uStack_145c;
  uint uStack_1458;
  uint uStack_1454;
  uint uStack_1450;
  uint uStack_144c;
  uint uStack_1448;
  uint uStack_1444;
  undefined1 local_1440 [8];
  float fStack_1438;
  float fStack_1434;
  float fStack_1430;
  float fStack_142c;
  float fStack_1428;
  undefined4 uStack_1424;
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  undefined4 uStack_13b0;
  undefined4 uStack_13ac;
  undefined4 uStack_13a8;
  undefined4 uStack_13a4;
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1720._4_4_ = uVar1;
  local_1720._0_4_ = uVar1;
  local_1720._8_4_ = uVar1;
  local_1720._12_4_ = uVar1;
  local_1720._16_4_ = uVar1;
  local_1720._20_4_ = uVar1;
  local_1720._24_4_ = uVar1;
  local_1720._28_4_ = uVar1;
  auVar130 = ZEXT3264(local_1720);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_1740._4_4_ = uVar1;
  local_1740._0_4_ = uVar1;
  local_1740._8_4_ = uVar1;
  local_1740._12_4_ = uVar1;
  local_1740._16_4_ = uVar1;
  local_1740._20_4_ = uVar1;
  local_1740._24_4_ = uVar1;
  local_1740._28_4_ = uVar1;
  auVar136 = ZEXT3264(local_1740);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1760._4_4_ = uVar1;
  local_1760._0_4_ = uVar1;
  local_1760._8_4_ = uVar1;
  local_1760._12_4_ = uVar1;
  local_1760._16_4_ = uVar1;
  local_1760._20_4_ = uVar1;
  local_1760._24_4_ = uVar1;
  local_1760._28_4_ = uVar1;
  auVar152 = ZEXT3264(local_1760);
  fVar132 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar138 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar140 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar142 = fVar132 * 0.99999964;
  fVar144 = fVar138 * 0.99999964;
  fVar146 = fVar140 * 0.99999964;
  fVar132 = fVar132 * 1.0000004;
  fVar138 = fVar138 * 1.0000004;
  fVar140 = fVar140 * 1.0000004;
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar76 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar80 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar63 = (tray->tnear).field_0.i[k];
  local_16e0._4_4_ = iVar63;
  local_16e0._0_4_ = iVar63;
  local_16e0._8_4_ = iVar63;
  local_16e0._12_4_ = iVar63;
  local_16e0._16_4_ = iVar63;
  local_16e0._20_4_ = iVar63;
  local_16e0._24_4_ = iVar63;
  local_16e0._28_4_ = iVar63;
  auVar118 = ZEXT3264(local_16e0);
  iVar63 = (tray->tfar).field_0.i[k];
  local_1700._4_4_ = iVar63;
  local_1700._0_4_ = iVar63;
  local_1700._8_4_ = iVar63;
  local_1700._12_4_ = iVar63;
  local_1700._16_4_ = iVar63;
  local_1700._20_4_ = iVar63;
  local_1700._24_4_ = iVar63;
  local_1700._28_4_ = iVar63;
  auVar127 = ZEXT3264(local_1700);
  local_1420._16_16_ = mm_lookupmask_ps._240_16_;
  local_1420._0_16_ = mm_lookupmask_ps._0_16_;
  local_18b0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = &DAT_3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar88._8_4_ = 0xbf800000;
  auVar88._0_8_ = 0xbf800000bf800000;
  auVar88._12_4_ = 0xbf800000;
  auVar88._16_4_ = 0xbf800000;
  auVar88._20_4_ = 0xbf800000;
  auVar88._24_4_ = 0xbf800000;
  auVar88._28_4_ = 0xbf800000;
  _local_1440 = vblendvps_avx(auVar100,auVar88,local_1420);
  puVar72 = local_11f8;
  fVar148 = fVar142;
  fVar156 = fVar142;
  fVar157 = fVar142;
  fVar158 = fVar142;
  fVar159 = fVar142;
  fVar160 = fVar142;
  fVar162 = fVar144;
  fVar163 = fVar144;
  fVar164 = fVar144;
  fVar165 = fVar144;
  fVar166 = fVar144;
  fVar167 = fVar144;
  fVar168 = fVar146;
  fVar169 = fVar146;
  fVar170 = fVar146;
  fVar171 = fVar146;
  fVar172 = fVar146;
  fVar173 = fVar146;
  fVar175 = fVar132;
  fVar176 = fVar132;
  fVar177 = fVar132;
  fVar178 = fVar132;
  fVar179 = fVar132;
  fVar180 = fVar132;
  fVar183 = fVar138;
  fVar184 = fVar138;
  fVar185 = fVar138;
  fVar186 = fVar138;
  fVar187 = fVar138;
  fVar188 = fVar138;
  fVar191 = fVar140;
  fVar192 = fVar140;
  fVar193 = fVar140;
  fVar194 = fVar140;
  fVar195 = fVar140;
  fVar196 = fVar140;
  local_1820 = fVar140;
  fStack_181c = fVar140;
  fStack_1818 = fVar140;
  fStack_1814 = fVar140;
  fStack_1810 = fVar140;
  fStack_180c = fVar140;
  fStack_1808 = fVar140;
  fStack_1804 = fVar140;
  local_1800 = fVar138;
  fStack_17fc = fVar138;
  fStack_17f8 = fVar138;
  fStack_17f4 = fVar138;
  fStack_17f0 = fVar138;
  fStack_17ec = fVar138;
  fStack_17e8 = fVar138;
  fStack_17e4 = fVar138;
  local_17e0 = fVar132;
  fStack_17dc = fVar132;
  fStack_17d8 = fVar132;
  fStack_17d4 = fVar132;
  fStack_17d0 = fVar132;
  fStack_17cc = fVar132;
  fStack_17c8 = fVar132;
  fStack_17c4 = fVar132;
  local_17c0 = fVar146;
  fStack_17bc = fVar146;
  fStack_17b8 = fVar146;
  fStack_17b4 = fVar146;
  fStack_17b0 = fVar146;
  fStack_17ac = fVar146;
  fStack_17a8 = fVar146;
  fStack_17a4 = fVar146;
  local_17a0 = fVar144;
  fStack_179c = fVar144;
  fStack_1798 = fVar144;
  fStack_1794 = fVar144;
  fStack_1790 = fVar144;
  fStack_178c = fVar144;
  fStack_1788 = fVar144;
  fStack_1784 = fVar144;
  local_1780 = fVar142;
  fStack_177c = fVar142;
  fStack_1778 = fVar142;
  fStack_1774 = fVar142;
  fStack_1770 = fVar142;
  fStack_176c = fVar142;
  fStack_1768 = fVar142;
  fStack_1764 = fVar142;
  do {
    local_1888 = puVar72;
    if (local_1888 == &local_1200) break;
    puVar72 = local_1888 + -1;
    uVar82 = local_1888[-1];
    do {
      if ((uVar82 & 8) == 0) {
        uVar60 = uVar82 & 0xfffffffffffffff0;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar89._4_4_ = uVar1;
        auVar89._0_4_ = uVar1;
        auVar89._8_4_ = uVar1;
        auVar89._12_4_ = uVar1;
        auVar89._16_4_ = uVar1;
        auVar89._20_4_ = uVar1;
        auVar89._24_4_ = uVar1;
        auVar89._28_4_ = uVar1;
        auVar86 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar60 + 0x100 + uVar66),auVar89,
                                  *(undefined1 (*) [32])(uVar60 + 0x40 + uVar66));
        auVar88 = vsubps_avx(ZEXT1632(auVar86),auVar130._0_32_);
        auVar97._4_4_ = fVar148 * auVar88._4_4_;
        auVar97._0_4_ = fVar142 * auVar88._0_4_;
        auVar97._8_4_ = fVar156 * auVar88._8_4_;
        auVar97._12_4_ = fVar157 * auVar88._12_4_;
        auVar97._16_4_ = fVar158 * auVar88._16_4_;
        auVar97._20_4_ = fVar159 * auVar88._20_4_;
        auVar97._24_4_ = fVar160 * auVar88._24_4_;
        auVar97._28_4_ = auVar88._28_4_;
        auVar86 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar60 + 0x100 + uVar76),auVar89,
                                  *(undefined1 (*) [32])(uVar60 + 0x40 + uVar76));
        auVar88 = vmaxps_avx(auVar118._0_32_,auVar97);
        auVar100 = vsubps_avx(ZEXT1632(auVar86),auVar136._0_32_);
        auVar27._4_4_ = fVar162 * auVar100._4_4_;
        auVar27._0_4_ = fVar144 * auVar100._0_4_;
        auVar27._8_4_ = fVar163 * auVar100._8_4_;
        auVar27._12_4_ = fVar164 * auVar100._12_4_;
        auVar27._16_4_ = fVar165 * auVar100._16_4_;
        auVar27._20_4_ = fVar166 * auVar100._20_4_;
        auVar27._24_4_ = fVar167 * auVar100._24_4_;
        auVar27._28_4_ = auVar100._28_4_;
        auVar86 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar60 + 0x100 + uVar80),auVar89,
                                  *(undefined1 (*) [32])(uVar60 + 0x40 + uVar80));
        auVar100 = vsubps_avx(ZEXT1632(auVar86),auVar152._0_32_);
        auVar28._4_4_ = fVar168 * auVar100._4_4_;
        auVar28._0_4_ = fVar146 * auVar100._0_4_;
        auVar28._8_4_ = fVar169 * auVar100._8_4_;
        auVar28._12_4_ = fVar170 * auVar100._12_4_;
        auVar28._16_4_ = fVar171 * auVar100._16_4_;
        auVar28._20_4_ = fVar172 * auVar100._20_4_;
        auVar28._24_4_ = fVar173 * auVar100._24_4_;
        auVar28._28_4_ = auVar100._28_4_;
        auVar100 = vmaxps_avx(auVar27,auVar28);
        auVar86 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar60 + 0x100 + (uVar66 ^ 0x20)),auVar89,
                                  *(undefined1 (*) [32])(uVar60 + 0x40 + (uVar66 ^ 0x20)));
        auVar88 = vmaxps_avx(auVar88,auVar100);
        auVar100 = vsubps_avx(ZEXT1632(auVar86),auVar130._0_32_);
        auVar29._4_4_ = fVar175 * auVar100._4_4_;
        auVar29._0_4_ = fVar132 * auVar100._0_4_;
        auVar29._8_4_ = fVar176 * auVar100._8_4_;
        auVar29._12_4_ = fVar177 * auVar100._12_4_;
        auVar29._16_4_ = fVar178 * auVar100._16_4_;
        auVar29._20_4_ = fVar179 * auVar100._20_4_;
        auVar29._24_4_ = fVar180 * auVar100._24_4_;
        auVar29._28_4_ = auVar100._28_4_;
        auVar100 = vminps_avx(auVar127._0_32_,auVar29);
        auVar86 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar60 + 0x100 + (uVar76 ^ 0x20)),auVar89,
                                  *(undefined1 (*) [32])(uVar60 + 0x40 + (uVar76 ^ 0x20)));
        auVar97 = vsubps_avx(ZEXT1632(auVar86),auVar136._0_32_);
        auVar30._4_4_ = fVar183 * auVar97._4_4_;
        auVar30._0_4_ = fVar138 * auVar97._0_4_;
        auVar30._8_4_ = fVar184 * auVar97._8_4_;
        auVar30._12_4_ = fVar185 * auVar97._12_4_;
        auVar30._16_4_ = fVar186 * auVar97._16_4_;
        auVar30._20_4_ = fVar187 * auVar97._20_4_;
        auVar30._24_4_ = fVar188 * auVar97._24_4_;
        auVar30._28_4_ = auVar97._28_4_;
        auVar86 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar60 + 0x100 + (uVar80 ^ 0x20)),auVar89,
                                  *(undefined1 (*) [32])(uVar60 + 0x40 + (uVar80 ^ 0x20)));
        auVar97 = vsubps_avx(ZEXT1632(auVar86),auVar152._0_32_);
        auVar33._4_4_ = fVar191 * auVar97._4_4_;
        auVar33._0_4_ = fVar140 * auVar97._0_4_;
        auVar33._8_4_ = fVar192 * auVar97._8_4_;
        auVar33._12_4_ = fVar193 * auVar97._12_4_;
        auVar33._16_4_ = fVar194 * auVar97._16_4_;
        auVar33._20_4_ = fVar195 * auVar97._20_4_;
        auVar33._24_4_ = fVar196 * auVar97._24_4_;
        auVar33._28_4_ = auVar97._28_4_;
        auVar97 = vminps_avx(auVar30,auVar33);
        auVar100 = vminps_avx(auVar100,auVar97);
        auVar88 = vcmpps_avx(auVar88,auVar100,2);
        if (((uint)uVar82 & 7) == 6) {
          auVar100 = vcmpps_avx(*(undefined1 (*) [32])(uVar60 + 0x1c0),auVar89,2);
          auVar97 = vcmpps_avx(auVar89,*(undefined1 (*) [32])(uVar60 + 0x1e0),1);
          auVar100 = vandps_avx(auVar100,auVar97);
          auVar88 = vandps_avx(auVar100,auVar88);
          auVar86 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
        }
        else {
          auVar86 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
        }
        auVar86 = vpsllw_avx(auVar86,0xf);
        auVar86 = vpacksswb_avx(auVar86,auVar86);
        unaff_RBX = (ulong)(byte)(SUB161(auVar86 >> 7,0) & 1 | (SUB161(auVar86 >> 0xf,0) & 1) << 1 |
                                  (SUB161(auVar86 >> 0x17,0) & 1) << 2 |
                                  (SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                                  (SUB161(auVar86 >> 0x27,0) & 1) << 4 |
                                  (SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                                  (SUB161(auVar86 >> 0x37,0) & 1) << 6 |
                                 SUB161(auVar86 >> 0x3f,0) << 7);
      }
      if ((uVar82 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar59 = 4;
        }
        else {
          uVar60 = uVar82 & 0xfffffffffffffff0;
          lVar64 = 0;
          for (uVar82 = unaff_RBX; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
            lVar64 = lVar64 + 1;
          }
          for (uVar61 = unaff_RBX - 1 & unaff_RBX; uVar82 = *(ulong *)(uVar60 + lVar64 * 8),
              uVar61 != 0; uVar61 = uVar61 - 1 & uVar61) {
            *puVar72 = uVar82;
            puVar72 = puVar72 + 1;
            lVar64 = 0;
            for (uVar82 = uVar61; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
              lVar64 = lVar64 + 1;
            }
          }
          uVar59 = 0;
        }
      }
      else {
        uVar59 = 6;
      }
    } while (uVar59 == 0);
    if (uVar59 == 6) {
      uVar59 = 0;
      local_18a8 = (ulong)((uint)uVar82 & 0xf) - 8;
      bVar84 = local_18a8 != 0;
      if (bVar84) {
        uVar82 = uVar82 & 0xfffffffffffffff0;
        local_18a0 = 0;
        do {
          lVar62 = local_18a0 * 0x60;
          pSVar7 = context->scene;
          pRVar8 = (pSVar7->geometries).items;
          pGVar9 = pRVar8[*(uint *)(uVar82 + 0x40 + lVar62)].ptr;
          fVar132 = (pGVar9->time_range).lower;
          fVar132 = pGVar9->fnumTimeSegments *
                    ((*(float *)(ray + k * 4 + 0x70) - fVar132) /
                    ((pGVar9->time_range).upper - fVar132));
          auVar86 = vroundss_avx(ZEXT416((uint)fVar132),ZEXT416((uint)fVar132),9);
          auVar86 = vminss_avx(auVar86,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
          auVar115 = vmaxss_avx(ZEXT816(0) << 0x20,auVar86);
          iVar63 = (int)auVar115._0_4_;
          lVar74 = (long)iVar63 * 0x38;
          lVar64 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar74);
          uVar73 = (ulong)*(uint *)(uVar82 + 4 + lVar62);
          auVar86 = *(undefined1 (*) [16])(lVar64 + (ulong)*(uint *)(uVar82 + lVar62) * 4);
          uVar61 = (ulong)*(uint *)(uVar82 + 0x10 + lVar62);
          auVar3 = *(undefined1 (*) [16])(lVar64 + uVar61 * 4);
          uVar65 = (ulong)*(uint *)(uVar82 + 0x20 + lVar62);
          auVar99 = *(undefined1 (*) [16])(lVar64 + uVar65 * 4);
          uVar67 = (ulong)*(uint *)(uVar82 + 0x30 + lVar62);
          auVar4 = *(undefined1 (*) [16])(lVar64 + uVar67 * 4);
          local_1890 = *(long *)&pRVar8[*(uint *)(uVar82 + 0x44 + lVar62)].ptr[2].numPrimitives;
          lVar64 = *(long *)(local_1890 + lVar74);
          auVar109 = *(undefined1 (*) [16])(lVar64 + uVar73 * 4);
          uVar68 = (ulong)*(uint *)(uVar82 + 0x14 + lVar62);
          auVar98 = *(undefined1 (*) [16])(lVar64 + uVar68 * 4);
          uVar69 = (ulong)*(uint *)(uVar82 + 0x24 + lVar62);
          auVar5 = *(undefined1 (*) [16])(lVar64 + uVar69 * 4);
          uVar70 = (ulong)*(uint *)(uVar82 + 0x34 + lVar62);
          auVar87 = *(undefined1 (*) [16])(lVar64 + uVar70 * 4);
          lVar64 = *(long *)&pRVar8[*(uint *)(uVar82 + 0x48 + lVar62)].ptr[2].numPrimitives;
          lVar10 = *(long *)(lVar64 + lVar74);
          uVar71 = (ulong)*(uint *)(uVar82 + 8 + lVar62);
          auVar106 = *(undefined1 (*) [16])(lVar10 + uVar71 * 4);
          local_1898 = (ulong)*(uint *)(uVar82 + 0x18 + lVar62);
          auVar189 = *(undefined1 (*) [16])(lVar10 + local_1898 * 4);
          uVar77 = (ulong)*(uint *)(uVar82 + 0x28 + lVar62);
          auVar6 = *(undefined1 (*) [16])(lVar10 + uVar77 * 4);
          uVar78 = (ulong)*(uint *)(uVar82 + 0x38 + lVar62);
          auVar149 = *(undefined1 (*) [16])(lVar10 + uVar78 * 4);
          fVar132 = fVar132 - auVar115._0_4_;
          lVar10 = *(long *)&pRVar8[*(uint *)(uVar82 + 0x4c + lVar62)].ptr[2].numPrimitives;
          lVar74 = *(long *)(lVar10 + lVar74);
          uVar60 = (ulong)*(uint *)(uVar82 + 0xc + lVar62);
          auVar115 = *(undefined1 (*) [16])(lVar74 + uVar60 * 4);
          uVar81 = (ulong)*(uint *)(uVar82 + 0x1c + lVar62);
          auVar128 = *(undefined1 (*) [16])(lVar74 + uVar81 * 4);
          auVar133 = vunpcklps_avx(auVar86,auVar106);
          auVar106 = vunpckhps_avx(auVar86,auVar106);
          auVar153 = vunpcklps_avx(auVar109,auVar115);
          auVar109 = vunpckhps_avx(auVar109,auVar115);
          uVar75 = (ulong)*(uint *)(uVar82 + 0x2c + lVar62);
          auVar86 = *(undefined1 (*) [16])(lVar74 + uVar75 * 4);
          auVar115 = vunpcklps_avx(auVar106,auVar109);
          local_14e0 = vunpcklps_avx(auVar133,auVar153);
          auVar109 = vunpckhps_avx(auVar133,auVar153);
          auVar133 = vunpcklps_avx(auVar3,auVar189);
          auVar106 = vunpckhps_avx(auVar3,auVar189);
          auVar189 = vunpcklps_avx(auVar98,auVar128);
          auVar98 = vunpckhps_avx(auVar98,auVar128);
          uVar79 = (ulong)*(uint *)(uVar82 + 0x3c + lVar62);
          auVar3 = *(undefined1 (*) [16])(lVar74 + uVar79 * 4);
          auVar106 = vunpcklps_avx(auVar106,auVar98);
          auVar128 = vunpcklps_avx(auVar133,auVar189);
          auVar98 = vunpckhps_avx(auVar133,auVar189);
          auVar189 = vunpcklps_avx(auVar99,auVar6);
          auVar99 = vunpckhps_avx(auVar99,auVar6);
          auVar6 = vunpcklps_avx(auVar5,auVar86);
          auVar5 = vunpckhps_avx(auVar5,auVar86);
          lVar83 = (long)(iVar63 + 1) * 0x38;
          lVar74 = *(long *)(*(long *)&pGVar9[2].numPrimitives + lVar83);
          auVar86 = *(undefined1 (*) [16])(lVar74 + (ulong)*(uint *)(uVar82 + lVar62) * 4);
          local_14f0 = vunpcklps_avx(auVar99,auVar5);
          auVar133 = vunpcklps_avx(auVar189,auVar6);
          local_1530 = vunpckhps_avx(auVar189,auVar6);
          auVar5 = vunpcklps_avx(auVar4,auVar149);
          auVar99 = vunpckhps_avx(auVar4,auVar149);
          auVar189 = vunpcklps_avx(auVar87,auVar3);
          auVar4 = vunpckhps_avx(auVar87,auVar3);
          lVar64 = *(long *)(lVar64 + lVar83);
          auVar3 = *(undefined1 (*) [16])(lVar64 + uVar71 * 4);
          local_1500 = vunpcklps_avx(auVar99,auVar4);
          local_1510 = vunpcklps_avx(auVar5,auVar189);
          local_1520 = vunpckhps_avx(auVar5,auVar189);
          lVar11 = *(long *)(local_1890 + lVar83);
          auVar4 = vunpcklps_avx(auVar86,auVar3);
          auVar99 = vunpckhps_avx(auVar86,auVar3);
          auVar86 = *(undefined1 (*) [16])(lVar11 + uVar73 * 4);
          lVar10 = *(long *)(lVar10 + lVar83);
          auVar3 = *(undefined1 (*) [16])(lVar10 + uVar60 * 4);
          auVar5 = vunpcklps_avx(auVar86,auVar3);
          auVar86 = vunpckhps_avx(auVar86,auVar3);
          auVar189 = vunpcklps_avx(auVar99,auVar86);
          auVar6 = vunpcklps_avx(auVar4,auVar5);
          auVar99 = vunpckhps_avx(auVar4,auVar5);
          auVar86 = *(undefined1 (*) [16])(lVar74 + uVar61 * 4);
          auVar3 = *(undefined1 (*) [16])(lVar64 + local_1898 * 4);
          auVar5 = vunpcklps_avx(auVar86,auVar3);
          auVar4 = vunpckhps_avx(auVar86,auVar3);
          auVar86 = *(undefined1 (*) [16])(lVar11 + uVar68 * 4);
          auVar3 = *(undefined1 (*) [16])(lVar10 + uVar81 * 4);
          auVar87 = vunpcklps_avx(auVar86,auVar3);
          auVar86 = vunpckhps_avx(auVar86,auVar3);
          auVar149 = vunpcklps_avx(auVar4,auVar86);
          auVar153 = vunpcklps_avx(auVar5,auVar87);
          auVar4 = vunpckhps_avx(auVar5,auVar87);
          auVar86 = *(undefined1 (*) [16])(lVar74 + uVar65 * 4);
          auVar3 = *(undefined1 (*) [16])(lVar64 + uVar77 * 4);
          auVar87 = vunpcklps_avx(auVar86,auVar3);
          auVar5 = vunpckhps_avx(auVar86,auVar3);
          auVar86 = *(undefined1 (*) [16])(lVar11 + uVar69 * 4);
          auVar3 = *(undefined1 (*) [16])(lVar10 + uVar75 * 4);
          auVar92 = vunpcklps_avx(auVar86,auVar3);
          auVar86 = vunpckhps_avx(auVar86,auVar3);
          auVar31 = vunpcklps_avx(auVar5,auVar86);
          auVar32 = vunpcklps_avx(auVar87,auVar92);
          auVar5 = vunpckhps_avx(auVar87,auVar92);
          auVar86 = *(undefined1 (*) [16])(lVar74 + uVar67 * 4);
          auVar3 = *(undefined1 (*) [16])(lVar64 + uVar78 * 4);
          auVar92 = vunpcklps_avx(auVar86,auVar3);
          auVar87 = vunpckhps_avx(auVar86,auVar3);
          auVar86 = *(undefined1 (*) [16])(lVar11 + uVar70 * 4);
          auVar3 = *(undefined1 (*) [16])(lVar10 + uVar79 * 4);
          auVar125 = vunpcklps_avx(auVar86,auVar3);
          auVar86 = vunpckhps_avx(auVar86,auVar3);
          auVar3 = vunpcklps_avx(auVar87,auVar86);
          auVar87 = vunpcklps_avx(auVar92,auVar125);
          auVar86 = vunpckhps_avx(auVar92,auVar125);
          fVar138 = 1.0 - fVar132;
          auVar181._4_4_ = fVar138;
          auVar181._0_4_ = fVar138;
          auVar181._8_4_ = fVar138;
          auVar181._12_4_ = fVar138;
          auVar92._0_4_ = fVar132 * auVar6._0_4_;
          auVar92._4_4_ = fVar132 * auVar6._4_4_;
          auVar92._8_4_ = fVar132 * auVar6._8_4_;
          auVar92._12_4_ = fVar132 * auVar6._12_4_;
          auVar6 = vfmadd231ps_fma(auVar92,auVar181,local_14e0);
          auVar125._0_4_ = fVar132 * auVar99._0_4_;
          auVar125._4_4_ = fVar132 * auVar99._4_4_;
          auVar125._8_4_ = fVar132 * auVar99._8_4_;
          auVar125._12_4_ = fVar132 * auVar99._12_4_;
          auVar99 = vfmadd231ps_fma(auVar125,auVar181,auVar109);
          auVar109._0_4_ = auVar189._0_4_ * fVar132;
          auVar109._4_4_ = auVar189._4_4_ * fVar132;
          auVar109._8_4_ = auVar189._8_4_ * fVar132;
          auVar109._12_4_ = auVar189._12_4_ * fVar132;
          auVar109 = vfmadd231ps_fma(auVar109,auVar181,auVar115);
          auVar189._0_4_ = fVar132 * auVar153._0_4_;
          auVar189._4_4_ = fVar132 * auVar153._4_4_;
          auVar189._8_4_ = fVar132 * auVar153._8_4_;
          auVar189._12_4_ = fVar132 * auVar153._12_4_;
          auVar189 = vfmadd231ps_fma(auVar189,auVar181,auVar128);
          auVar115._0_4_ = fVar132 * auVar4._0_4_;
          auVar115._4_4_ = fVar132 * auVar4._4_4_;
          auVar115._8_4_ = fVar132 * auVar4._8_4_;
          auVar115._12_4_ = fVar132 * auVar4._12_4_;
          auVar4 = vfmadd231ps_fma(auVar115,auVar181,auVar98);
          auVar98._0_4_ = auVar149._0_4_ * fVar132;
          auVar98._4_4_ = auVar149._4_4_ * fVar132;
          auVar98._8_4_ = auVar149._8_4_ * fVar132;
          auVar98._12_4_ = auVar149._12_4_ * fVar132;
          auVar98 = vfmadd231ps_fma(auVar98,auVar181,auVar106);
          auVar106._0_4_ = fVar132 * auVar32._0_4_;
          auVar106._4_4_ = fVar132 * auVar32._4_4_;
          auVar106._8_4_ = fVar132 * auVar32._8_4_;
          auVar106._12_4_ = fVar132 * auVar32._12_4_;
          auVar106 = vfmadd231ps_fma(auVar106,auVar181,auVar133);
          auVar149._0_4_ = auVar5._0_4_ * fVar132;
          auVar149._4_4_ = auVar5._4_4_ * fVar132;
          auVar149._8_4_ = auVar5._8_4_ * fVar132;
          auVar149._12_4_ = auVar5._12_4_ * fVar132;
          auVar5 = vfmadd231ps_fma(auVar149,auVar181,local_1530);
          auVar153._0_4_ = auVar31._0_4_ * fVar132;
          auVar153._4_4_ = auVar31._4_4_ * fVar132;
          auVar153._8_4_ = auVar31._8_4_ * fVar132;
          auVar153._12_4_ = auVar31._12_4_ * fVar132;
          auVar149 = vfmadd231ps_fma(auVar153,auVar181,local_14f0);
          auVar128._0_4_ = fVar132 * auVar87._0_4_;
          auVar128._4_4_ = fVar132 * auVar87._4_4_;
          auVar128._8_4_ = fVar132 * auVar87._8_4_;
          auVar128._12_4_ = fVar132 * auVar87._12_4_;
          auVar133._0_4_ = auVar86._0_4_ * fVar132;
          auVar133._4_4_ = auVar86._4_4_ * fVar132;
          auVar133._8_4_ = auVar86._8_4_ * fVar132;
          auVar133._12_4_ = auVar86._12_4_ * fVar132;
          lVar64 = uVar82 + 0x40 + lVar62;
          local_13e0 = *(undefined8 *)(lVar64 + 0x10);
          uStack_13d8 = *(undefined8 *)(lVar64 + 0x18);
          auVar87._0_4_ = auVar3._0_4_ * fVar132;
          auVar87._4_4_ = auVar3._4_4_ * fVar132;
          auVar87._8_4_ = auVar3._8_4_ * fVar132;
          auVar87._12_4_ = auVar3._12_4_ * fVar132;
          uStack_13d0 = local_13e0;
          uStack_13c8 = uStack_13d8;
          lVar62 = uVar82 + 0x50 + lVar62;
          local_1400 = *(undefined8 *)(lVar62 + 0x10);
          uStack_13f8 = *(undefined8 *)(lVar62 + 0x18);
          auVar86 = vfmadd231ps_fma(auVar128,auVar181,local_1510);
          auVar3 = vfmadd231ps_fma(auVar133,auVar181,local_1520);
          auVar87 = vfmadd231ps_fma(auVar87,auVar181,local_1500);
          uStack_13f0 = local_1400;
          uStack_13e8 = uStack_13f8;
          auVar93._16_16_ = auVar106;
          auVar93._0_16_ = auVar6;
          auVar107._16_16_ = auVar5;
          auVar107._0_16_ = auVar99;
          auVar110._16_16_ = auVar149;
          auVar110._0_16_ = auVar109;
          auVar154._16_16_ = auVar189;
          auVar154._0_16_ = auVar189;
          auVar116._16_16_ = auVar4;
          auVar116._0_16_ = auVar4;
          auVar101._16_16_ = auVar98;
          auVar101._0_16_ = auVar98;
          auVar190._16_16_ = auVar86;
          auVar190._0_16_ = auVar86;
          auVar134._16_16_ = auVar3;
          auVar134._0_16_ = auVar3;
          uVar1 = *(undefined4 *)(ray + k * 4);
          auVar161._4_4_ = uVar1;
          auVar161._0_4_ = uVar1;
          auVar161._8_4_ = uVar1;
          auVar161._12_4_ = uVar1;
          auVar161._16_4_ = uVar1;
          auVar161._20_4_ = uVar1;
          auVar161._24_4_ = uVar1;
          auVar161._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar174._4_4_ = uVar1;
          auVar174._0_4_ = uVar1;
          auVar174._8_4_ = uVar1;
          auVar174._12_4_ = uVar1;
          auVar174._16_4_ = uVar1;
          auVar174._20_4_ = uVar1;
          auVar174._24_4_ = uVar1;
          auVar174._28_4_ = uVar1;
          auVar90._16_16_ = auVar87;
          auVar90._0_16_ = auVar87;
          uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar182._4_4_ = uVar2;
          auVar182._0_4_ = uVar2;
          auVar182._8_4_ = uVar2;
          auVar182._12_4_ = uVar2;
          auVar182._16_4_ = uVar2;
          auVar182._20_4_ = uVar2;
          auVar182._24_4_ = uVar2;
          auVar182._28_4_ = uVar2;
          local_1560 = vsubps_avx(auVar93,auVar161);
          local_1580 = vsubps_avx(auVar107,auVar174);
          local_15a0 = vsubps_avx(auVar110,auVar182);
          auVar88 = vsubps_avx(auVar154,auVar161);
          auVar100 = vsubps_avx(auVar116,auVar174);
          auVar97 = vsubps_avx(auVar101,auVar182);
          auVar27 = vsubps_avx(auVar190,auVar161);
          auVar28 = vsubps_avx(auVar134,auVar174);
          auVar29 = vsubps_avx(auVar90,auVar182);
          local_15c0 = vsubps_avx(auVar27,local_1560);
          local_1600 = vsubps_avx(auVar28,local_1580);
          local_15e0 = vsubps_avx(auVar29,local_15a0);
          auVar91._0_4_ = local_1560._0_4_ + auVar27._0_4_;
          auVar91._4_4_ = local_1560._4_4_ + auVar27._4_4_;
          auVar91._8_4_ = local_1560._8_4_ + auVar27._8_4_;
          auVar91._12_4_ = local_1560._12_4_ + auVar27._12_4_;
          auVar91._16_4_ = local_1560._16_4_ + auVar27._16_4_;
          auVar91._20_4_ = local_1560._20_4_ + auVar27._20_4_;
          auVar91._24_4_ = local_1560._24_4_ + auVar27._24_4_;
          auVar91._28_4_ = local_1560._28_4_ + auVar27._28_4_;
          auVar108._0_4_ = auVar28._0_4_ + local_1580._0_4_;
          auVar108._4_4_ = auVar28._4_4_ + local_1580._4_4_;
          auVar108._8_4_ = auVar28._8_4_ + local_1580._8_4_;
          auVar108._12_4_ = auVar28._12_4_ + local_1580._12_4_;
          auVar108._16_4_ = auVar28._16_4_ + local_1580._16_4_;
          auVar108._20_4_ = auVar28._20_4_ + local_1580._20_4_;
          auVar108._24_4_ = auVar28._24_4_ + local_1580._24_4_;
          fVar132 = local_1580._28_4_;
          auVar108._28_4_ = auVar28._28_4_ + fVar132;
          fVar13 = local_15a0._0_4_;
          auVar111._0_4_ = auVar29._0_4_ + fVar13;
          fVar14 = local_15a0._4_4_;
          auVar111._4_4_ = auVar29._4_4_ + fVar14;
          fVar15 = local_15a0._8_4_;
          auVar111._8_4_ = auVar29._8_4_ + fVar15;
          fVar16 = local_15a0._12_4_;
          auVar111._12_4_ = auVar29._12_4_ + fVar16;
          fVar17 = local_15a0._16_4_;
          auVar111._16_4_ = auVar29._16_4_ + fVar17;
          fVar18 = local_15a0._20_4_;
          auVar111._20_4_ = auVar29._20_4_ + fVar18;
          fVar19 = local_15a0._24_4_;
          auVar111._24_4_ = auVar29._24_4_ + fVar19;
          fVar140 = auVar29._28_4_;
          auVar111._28_4_ = fVar140 + local_15a0._28_4_;
          auVar34._4_4_ = local_15e0._4_4_ * auVar108._4_4_;
          auVar34._0_4_ = local_15e0._0_4_ * auVar108._0_4_;
          auVar34._8_4_ = local_15e0._8_4_ * auVar108._8_4_;
          auVar34._12_4_ = local_15e0._12_4_ * auVar108._12_4_;
          auVar34._16_4_ = local_15e0._16_4_ * auVar108._16_4_;
          auVar34._20_4_ = local_15e0._20_4_ * auVar108._20_4_;
          auVar34._24_4_ = local_15e0._24_4_ * auVar108._24_4_;
          auVar34._28_4_ = uVar1;
          auVar3 = vfmsub231ps_fma(auVar34,local_1600,auVar111);
          auVar35._4_4_ = local_15c0._4_4_ * auVar111._4_4_;
          auVar35._0_4_ = local_15c0._0_4_ * auVar111._0_4_;
          auVar35._8_4_ = local_15c0._8_4_ * auVar111._8_4_;
          auVar35._12_4_ = local_15c0._12_4_ * auVar111._12_4_;
          auVar35._16_4_ = local_15c0._16_4_ * auVar111._16_4_;
          auVar35._20_4_ = local_15c0._20_4_ * auVar111._20_4_;
          auVar35._24_4_ = local_15c0._24_4_ * auVar111._24_4_;
          auVar35._28_4_ = auVar111._28_4_;
          auVar86 = vfmsub231ps_fma(auVar35,local_15e0,auVar91);
          auVar36._4_4_ = auVar91._4_4_ * local_1600._4_4_;
          auVar36._0_4_ = auVar91._0_4_ * local_1600._0_4_;
          auVar36._8_4_ = auVar91._8_4_ * local_1600._8_4_;
          auVar36._12_4_ = auVar91._12_4_ * local_1600._12_4_;
          auVar36._16_4_ = auVar91._16_4_ * local_1600._16_4_;
          auVar36._20_4_ = auVar91._20_4_ * local_1600._20_4_;
          auVar36._24_4_ = auVar91._24_4_ * local_1600._24_4_;
          auVar36._28_4_ = auVar91._28_4_;
          auVar99 = vfmsub231ps_fma(auVar36,local_15c0,auVar108);
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar129._4_4_ = uVar1;
          auVar129._0_4_ = uVar1;
          auVar129._8_4_ = uVar1;
          auVar129._12_4_ = uVar1;
          auVar129._16_4_ = uVar1;
          auVar129._20_4_ = uVar1;
          auVar129._24_4_ = uVar1;
          auVar129._28_4_ = uVar1;
          fStack_1610 = *(float *)(ray + k * 4 + 0x60);
          auVar37._4_4_ = fStack_1610 * auVar99._4_4_;
          auVar37._0_4_ = fStack_1610 * auVar99._0_4_;
          auVar37._8_4_ = fStack_1610 * auVar99._8_4_;
          auVar37._12_4_ = fStack_1610 * auVar99._12_4_;
          auVar37._16_4_ = fStack_1610 * 0.0;
          auVar37._20_4_ = fStack_1610 * 0.0;
          auVar37._24_4_ = fStack_1610 * 0.0;
          auVar37._28_4_ = auVar108._28_4_;
          auVar86 = vfmadd231ps_fma(auVar37,auVar129,ZEXT1632(auVar86));
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
          local_1880._4_4_ = uVar1;
          local_1880._0_4_ = uVar1;
          local_1880._8_4_ = uVar1;
          local_1880._12_4_ = uVar1;
          local_1880._16_4_ = uVar1;
          local_1880._20_4_ = uVar1;
          local_1880._24_4_ = uVar1;
          local_1880._28_4_ = uVar1;
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),local_1880,ZEXT1632(auVar3));
          local_1640 = vsubps_avx(local_1580,auVar100);
          local_1680 = vsubps_avx(local_15a0,auVar97);
          auVar102._0_4_ = auVar100._0_4_ + local_1580._0_4_;
          auVar102._4_4_ = auVar100._4_4_ + local_1580._4_4_;
          auVar102._8_4_ = auVar100._8_4_ + local_1580._8_4_;
          auVar102._12_4_ = auVar100._12_4_ + local_1580._12_4_;
          auVar102._16_4_ = auVar100._16_4_ + local_1580._16_4_;
          auVar102._20_4_ = auVar100._20_4_ + local_1580._20_4_;
          auVar102._24_4_ = auVar100._24_4_ + local_1580._24_4_;
          auVar102._28_4_ = auVar100._28_4_ + fVar132;
          auVar112._0_4_ = fVar13 + auVar97._0_4_;
          auVar112._4_4_ = fVar14 + auVar97._4_4_;
          auVar112._8_4_ = fVar15 + auVar97._8_4_;
          auVar112._12_4_ = fVar16 + auVar97._12_4_;
          auVar112._16_4_ = fVar17 + auVar97._16_4_;
          auVar112._20_4_ = fVar18 + auVar97._20_4_;
          auVar112._24_4_ = fVar19 + auVar97._24_4_;
          fVar138 = auVar97._28_4_;
          auVar112._28_4_ = local_15a0._28_4_ + fVar138;
          fVar131 = local_1680._0_4_;
          fVar137 = local_1680._4_4_;
          auVar38._4_4_ = fVar137 * auVar102._4_4_;
          auVar38._0_4_ = fVar131 * auVar102._0_4_;
          fVar139 = local_1680._8_4_;
          auVar38._8_4_ = fVar139 * auVar102._8_4_;
          fVar141 = local_1680._12_4_;
          auVar38._12_4_ = fVar141 * auVar102._12_4_;
          fVar143 = local_1680._16_4_;
          auVar38._16_4_ = fVar143 * auVar102._16_4_;
          fVar145 = local_1680._20_4_;
          auVar38._20_4_ = fVar145 * auVar102._20_4_;
          fVar147 = local_1680._24_4_;
          auVar38._24_4_ = fVar147 * auVar102._24_4_;
          auVar38._28_4_ = fVar132;
          auVar99 = vfmsub231ps_fma(auVar38,local_1640,auVar112);
          local_1660 = vsubps_avx(local_1560,auVar88);
          fVar114 = local_1660._0_4_;
          fVar120 = local_1660._4_4_;
          auVar39._4_4_ = auVar112._4_4_ * fVar120;
          auVar39._0_4_ = auVar112._0_4_ * fVar114;
          fVar122 = local_1660._8_4_;
          auVar39._8_4_ = auVar112._8_4_ * fVar122;
          fVar124 = local_1660._12_4_;
          auVar39._12_4_ = auVar112._12_4_ * fVar124;
          fVar21 = local_1660._16_4_;
          auVar39._16_4_ = auVar112._16_4_ * fVar21;
          fVar23 = local_1660._20_4_;
          auVar39._20_4_ = auVar112._20_4_ * fVar23;
          fVar25 = local_1660._24_4_;
          auVar39._24_4_ = auVar112._24_4_ * fVar25;
          auVar39._28_4_ = auVar112._28_4_;
          auVar150._0_4_ = local_1560._0_4_ + auVar88._0_4_;
          auVar150._4_4_ = local_1560._4_4_ + auVar88._4_4_;
          auVar150._8_4_ = local_1560._8_4_ + auVar88._8_4_;
          auVar150._12_4_ = local_1560._12_4_ + auVar88._12_4_;
          auVar150._16_4_ = local_1560._16_4_ + auVar88._16_4_;
          auVar150._20_4_ = local_1560._20_4_ + auVar88._20_4_;
          auVar150._24_4_ = local_1560._24_4_ + auVar88._24_4_;
          auVar150._28_4_ = local_1560._28_4_ + auVar88._28_4_;
          auVar3 = vfmsub231ps_fma(auVar39,local_1680,auVar150);
          fVar119 = local_1640._0_4_;
          fVar121 = local_1640._4_4_;
          auVar40._4_4_ = auVar150._4_4_ * fVar121;
          auVar40._0_4_ = auVar150._0_4_ * fVar119;
          fVar123 = local_1640._8_4_;
          auVar40._8_4_ = auVar150._8_4_ * fVar123;
          fVar20 = local_1640._12_4_;
          auVar40._12_4_ = auVar150._12_4_ * fVar20;
          fVar22 = local_1640._16_4_;
          auVar40._16_4_ = auVar150._16_4_ * fVar22;
          fVar24 = local_1640._20_4_;
          auVar40._20_4_ = auVar150._20_4_ * fVar24;
          fVar26 = local_1640._24_4_;
          auVar40._24_4_ = auVar150._24_4_ * fVar26;
          auVar40._28_4_ = local_1680._28_4_;
          auVar4 = vfmsub231ps_fma(auVar40,local_1660,auVar102);
          auVar41._4_4_ = auVar4._4_4_ * fStack_1610;
          auVar41._0_4_ = auVar4._0_4_ * fStack_1610;
          auVar41._8_4_ = auVar4._8_4_ * fStack_1610;
          auVar41._12_4_ = auVar4._12_4_ * fStack_1610;
          auVar41._16_4_ = fStack_1610 * 0.0;
          auVar41._20_4_ = fStack_1610 * 0.0;
          auVar41._24_4_ = fStack_1610 * 0.0;
          auVar41._28_4_ = fVar138;
          auVar3 = vfmadd231ps_fma(auVar41,auVar129,ZEXT1632(auVar3));
          auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),local_1880,ZEXT1632(auVar99));
          auVar30 = vsubps_avx(auVar88,auVar27);
          auVar103._0_4_ = auVar88._0_4_ + auVar27._0_4_;
          auVar103._4_4_ = auVar88._4_4_ + auVar27._4_4_;
          auVar103._8_4_ = auVar88._8_4_ + auVar27._8_4_;
          auVar103._12_4_ = auVar88._12_4_ + auVar27._12_4_;
          auVar103._16_4_ = auVar88._16_4_ + auVar27._16_4_;
          auVar103._20_4_ = auVar88._20_4_ + auVar27._20_4_;
          auVar103._24_4_ = auVar88._24_4_ + auVar27._24_4_;
          auVar103._28_4_ = auVar88._28_4_ + auVar27._28_4_;
          auVar27 = vsubps_avx(auVar100,auVar28);
          auVar117._0_4_ = auVar100._0_4_ + auVar28._0_4_;
          auVar117._4_4_ = auVar100._4_4_ + auVar28._4_4_;
          auVar117._8_4_ = auVar100._8_4_ + auVar28._8_4_;
          auVar117._12_4_ = auVar100._12_4_ + auVar28._12_4_;
          auVar117._16_4_ = auVar100._16_4_ + auVar28._16_4_;
          auVar117._20_4_ = auVar100._20_4_ + auVar28._20_4_;
          auVar117._24_4_ = auVar100._24_4_ + auVar28._24_4_;
          auVar117._28_4_ = auVar100._28_4_ + auVar28._28_4_;
          auVar28 = vsubps_avx(auVar97,auVar29);
          auVar94._0_4_ = auVar97._0_4_ + auVar29._0_4_;
          auVar94._4_4_ = auVar97._4_4_ + auVar29._4_4_;
          auVar94._8_4_ = auVar97._8_4_ + auVar29._8_4_;
          auVar94._12_4_ = auVar97._12_4_ + auVar29._12_4_;
          auVar94._16_4_ = auVar97._16_4_ + auVar29._16_4_;
          auVar94._20_4_ = auVar97._20_4_ + auVar29._20_4_;
          auVar94._24_4_ = auVar97._24_4_ + auVar29._24_4_;
          auVar94._28_4_ = fVar138 + fVar140;
          auVar42._4_4_ = auVar28._4_4_ * auVar117._4_4_;
          auVar42._0_4_ = auVar28._0_4_ * auVar117._0_4_;
          auVar42._8_4_ = auVar28._8_4_ * auVar117._8_4_;
          auVar42._12_4_ = auVar28._12_4_ * auVar117._12_4_;
          auVar42._16_4_ = auVar28._16_4_ * auVar117._16_4_;
          auVar42._20_4_ = auVar28._20_4_ * auVar117._20_4_;
          auVar42._24_4_ = auVar28._24_4_ * auVar117._24_4_;
          auVar42._28_4_ = fVar140;
          auVar4 = vfmsub231ps_fma(auVar42,auVar27,auVar94);
          auVar43._4_4_ = auVar94._4_4_ * auVar30._4_4_;
          auVar43._0_4_ = auVar94._0_4_ * auVar30._0_4_;
          auVar43._8_4_ = auVar94._8_4_ * auVar30._8_4_;
          auVar43._12_4_ = auVar94._12_4_ * auVar30._12_4_;
          auVar43._16_4_ = auVar94._16_4_ * auVar30._16_4_;
          auVar43._20_4_ = auVar94._20_4_ * auVar30._20_4_;
          auVar43._24_4_ = auVar94._24_4_ * auVar30._24_4_;
          auVar43._28_4_ = auVar94._28_4_;
          auVar99 = vfmsub231ps_fma(auVar43,auVar28,auVar103);
          auVar44._4_4_ = auVar27._4_4_ * auVar103._4_4_;
          auVar44._0_4_ = auVar27._0_4_ * auVar103._0_4_;
          auVar44._8_4_ = auVar27._8_4_ * auVar103._8_4_;
          auVar44._12_4_ = auVar27._12_4_ * auVar103._12_4_;
          auVar44._16_4_ = auVar27._16_4_ * auVar103._16_4_;
          auVar44._20_4_ = auVar27._20_4_ * auVar103._20_4_;
          auVar44._24_4_ = auVar27._24_4_ * auVar103._24_4_;
          auVar44._28_4_ = auVar103._28_4_;
          auVar109 = vfmsub231ps_fma(auVar44,auVar30,auVar117);
          fStack_161c = fStack_1610;
          local_1620 = fStack_1610;
          fStack_1618 = fStack_1610;
          fStack_1614 = fStack_1610;
          auVar104._0_4_ = fStack_1610 * auVar109._0_4_;
          auVar104._4_4_ = fStack_1610 * auVar109._4_4_;
          auVar104._8_4_ = fStack_1610 * auVar109._8_4_;
          auVar104._12_4_ = fStack_1610 * auVar109._12_4_;
          auVar104._16_4_ = fStack_1610 * 0.0;
          auVar104._20_4_ = fStack_1610 * 0.0;
          auVar104._24_4_ = fStack_1610 * 0.0;
          auVar104._28_4_ = 0;
          auVar99 = vfmadd231ps_fma(auVar104,auVar129,ZEXT1632(auVar99));
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),local_1880,ZEXT1632(auVar4));
          local_13c0 = auVar86._0_4_;
          fStack_13bc = auVar86._4_4_;
          fStack_13b8 = auVar86._8_4_;
          fStack_13b4 = auVar86._12_4_;
          local_1380 = ZEXT1632(CONCAT412(auVar99._12_4_ + fStack_13b4 + auVar3._12_4_,
                                          CONCAT48(auVar99._8_4_ + fStack_13b8 + auVar3._8_4_,
                                                   CONCAT44(auVar99._4_4_ +
                                                            fStack_13bc + auVar3._4_4_,
                                                            auVar99._0_4_ +
                                                            local_13c0 + auVar3._0_4_))));
          auVar95._8_4_ = 0x7fffffff;
          auVar95._0_8_ = 0x7fffffff7fffffff;
          auVar95._12_4_ = 0x7fffffff;
          auVar95._16_4_ = 0x7fffffff;
          auVar95._20_4_ = 0x7fffffff;
          auVar95._24_4_ = 0x7fffffff;
          auVar95._28_4_ = 0x7fffffff;
          local_16a0 = ZEXT1632(auVar86);
          auVar88 = vminps_avx(local_16a0,ZEXT1632(auVar3));
          auVar88 = vminps_avx(auVar88,ZEXT1632(auVar99));
          local_16c0 = vandps_avx(local_1380,auVar95);
          fVar132 = local_16c0._0_4_ * 1.1920929e-07;
          fVar138 = local_16c0._4_4_ * 1.1920929e-07;
          auVar45._4_4_ = fVar138;
          auVar45._0_4_ = fVar132;
          fVar140 = local_16c0._8_4_ * 1.1920929e-07;
          auVar45._8_4_ = fVar140;
          fVar142 = local_16c0._12_4_ * 1.1920929e-07;
          auVar45._12_4_ = fVar142;
          fVar144 = local_16c0._16_4_ * 1.1920929e-07;
          auVar45._16_4_ = fVar144;
          fVar146 = local_16c0._20_4_ * 1.1920929e-07;
          auVar45._20_4_ = fVar146;
          fVar148 = local_16c0._24_4_ * 1.1920929e-07;
          auVar45._24_4_ = fVar148;
          auVar45._28_4_ = 0x34000000;
          auVar126._0_8_ = CONCAT44(fVar138,fVar132) ^ 0x8000000080000000;
          auVar126._8_4_ = -fVar140;
          auVar126._12_4_ = -fVar142;
          auVar126._16_4_ = -fVar144;
          auVar126._20_4_ = -fVar146;
          auVar126._24_4_ = -fVar148;
          auVar126._28_4_ = 0xb4000000;
          auVar88 = vcmpps_avx(auVar88,auVar126,5);
          auVar97 = vmaxps_avx(local_16a0,ZEXT1632(auVar3));
          auVar100 = vmaxps_avx(auVar97,ZEXT1632(auVar99));
          auVar100 = vcmpps_avx(auVar100,auVar45,2);
          auVar100 = vorps_avx(auVar88,auVar100);
          fVar148 = fStack_177c;
          fVar156 = fStack_1778;
          fVar157 = fStack_1774;
          fVar158 = fStack_1770;
          fVar159 = fStack_176c;
          fVar160 = fStack_1768;
          fVar142 = local_1780;
          fVar162 = fStack_179c;
          fVar163 = fStack_1798;
          fVar164 = fStack_1794;
          fVar165 = fStack_1790;
          fVar166 = fStack_178c;
          fVar167 = fStack_1788;
          fVar144 = local_17a0;
          fVar168 = fStack_17bc;
          fVar169 = fStack_17b8;
          fVar170 = fStack_17b4;
          fVar171 = fStack_17b0;
          fVar172 = fStack_17ac;
          fVar173 = fStack_17a8;
          fVar146 = local_17c0;
          fVar175 = fStack_17dc;
          fVar176 = fStack_17d8;
          fVar177 = fStack_17d4;
          fVar178 = fStack_17d0;
          fVar179 = fStack_17cc;
          fVar180 = fStack_17c8;
          fVar132 = local_17e0;
          fVar183 = fStack_17fc;
          fVar184 = fStack_17f8;
          fVar185 = fStack_17f4;
          fVar186 = fStack_17f0;
          fVar187 = fStack_17ec;
          fVar188 = fStack_17e8;
          fVar138 = local_1800;
          fVar191 = fStack_181c;
          fVar192 = fStack_1818;
          fVar193 = fStack_1814;
          fVar194 = fStack_1810;
          fVar195 = fStack_180c;
          fVar196 = fStack_1808;
          fVar140 = local_1820;
          if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar100 >> 0x7f,0) == '\0') &&
                (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar100 >> 0xbf,0) == '\0') &&
              (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar100[0x1f]) {
LAB_00671ccc:
            auVar130 = ZEXT3264(local_1720);
            auVar136 = ZEXT3264(local_1740);
            auVar152 = ZEXT3264(local_1760);
            auVar118 = ZEXT3264(local_16e0);
            auVar127 = ZEXT3264(local_1700);
          }
          else {
            auVar46._4_4_ = fVar121 * local_15e0._4_4_;
            auVar46._0_4_ = fVar119 * local_15e0._0_4_;
            auVar46._8_4_ = fVar123 * local_15e0._8_4_;
            auVar46._12_4_ = fVar20 * local_15e0._12_4_;
            auVar46._16_4_ = fVar22 * local_15e0._16_4_;
            auVar46._20_4_ = fVar24 * local_15e0._20_4_;
            auVar46._24_4_ = fVar26 * local_15e0._24_4_;
            auVar46._28_4_ = auVar88._28_4_;
            auVar47._4_4_ = fVar120 * local_1600._4_4_;
            auVar47._0_4_ = fVar114 * local_1600._0_4_;
            auVar47._8_4_ = fVar122 * local_1600._8_4_;
            auVar47._12_4_ = fVar124 * local_1600._12_4_;
            auVar47._16_4_ = fVar21 * local_1600._16_4_;
            auVar47._20_4_ = fVar23 * local_1600._20_4_;
            auVar47._24_4_ = fVar25 * local_1600._24_4_;
            auVar47._28_4_ = 0x34000000;
            auVar86 = vfmsub213ps_fma(local_1600,local_1680,auVar46);
            auVar48._4_4_ = auVar27._4_4_ * fVar137;
            auVar48._0_4_ = auVar27._0_4_ * fVar131;
            auVar48._8_4_ = auVar27._8_4_ * fVar139;
            auVar48._12_4_ = auVar27._12_4_ * fVar141;
            auVar48._16_4_ = auVar27._16_4_ * fVar143;
            auVar48._20_4_ = auVar27._20_4_ * fVar145;
            auVar48._24_4_ = auVar27._24_4_ * fVar147;
            auVar48._28_4_ = auVar97._28_4_;
            auVar49._4_4_ = fVar120 * auVar28._4_4_;
            auVar49._0_4_ = fVar114 * auVar28._0_4_;
            auVar49._8_4_ = fVar122 * auVar28._8_4_;
            auVar49._12_4_ = fVar124 * auVar28._12_4_;
            auVar49._16_4_ = fVar21 * auVar28._16_4_;
            auVar49._20_4_ = fVar23 * auVar28._20_4_;
            auVar49._24_4_ = fVar25 * auVar28._24_4_;
            auVar49._28_4_ = local_16c0._28_4_;
            auVar99 = vfmsub213ps_fma(auVar28,local_1640,auVar48);
            auVar88 = vandps_avx(auVar46,auVar95);
            auVar97 = vandps_avx(auVar48,auVar95);
            auVar88 = vcmpps_avx(auVar88,auVar97,1);
            local_1360 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar86),auVar88);
            auVar50._4_4_ = fVar121 * auVar30._4_4_;
            auVar50._0_4_ = fVar119 * auVar30._0_4_;
            auVar50._8_4_ = fVar123 * auVar30._8_4_;
            auVar50._12_4_ = fVar20 * auVar30._12_4_;
            auVar50._16_4_ = fVar22 * auVar30._16_4_;
            auVar50._20_4_ = fVar24 * auVar30._20_4_;
            auVar50._24_4_ = fVar26 * auVar30._24_4_;
            auVar50._28_4_ = auVar88._28_4_;
            auVar86 = vfmsub213ps_fma(auVar30,local_1680,auVar49);
            auVar51._4_4_ = local_15c0._4_4_ * fVar137;
            auVar51._0_4_ = local_15c0._0_4_ * fVar131;
            auVar51._8_4_ = local_15c0._8_4_ * fVar139;
            auVar51._12_4_ = local_15c0._12_4_ * fVar141;
            auVar51._16_4_ = local_15c0._16_4_ * fVar143;
            auVar51._20_4_ = local_15c0._20_4_ * fVar145;
            auVar51._24_4_ = local_15c0._24_4_ * fVar147;
            auVar51._28_4_ = auVar97._28_4_;
            auVar99 = vfmsub213ps_fma(local_15e0,local_1660,auVar51);
            auVar88 = vandps_avx(auVar51,auVar95);
            auVar97 = vandps_avx(auVar49,auVar95);
            auVar88 = vcmpps_avx(auVar88,auVar97,1);
            local_1340 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar99),auVar88);
            auVar86 = vfmsub213ps_fma(local_15c0,local_1640,auVar47);
            auVar99 = vfmsub213ps_fma(auVar27,local_1660,auVar50);
            auVar88 = vandps_avx(auVar47,auVar95);
            auVar97 = vandps_avx(auVar50,auVar95);
            auVar88 = vcmpps_avx(auVar88,auVar97,1);
            local_1320 = vblendvps_avx(ZEXT1632(auVar99),ZEXT1632(auVar86),auVar88);
            auVar86 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
            fVar114 = local_1320._0_4_;
            auVar96._0_4_ = fVar114 * fStack_1610;
            fVar119 = local_1320._4_4_;
            auVar96._4_4_ = fVar119 * fStack_1610;
            fVar120 = local_1320._8_4_;
            auVar96._8_4_ = fVar120 * fStack_1610;
            fVar121 = local_1320._12_4_;
            auVar96._12_4_ = fVar121 * fStack_1610;
            fVar122 = local_1320._16_4_;
            auVar96._16_4_ = fVar122 * fStack_1610;
            fVar123 = local_1320._20_4_;
            auVar96._20_4_ = fVar123 * fStack_1610;
            fVar124 = local_1320._24_4_;
            auVar96._24_4_ = fVar124 * fStack_1610;
            auVar96._28_4_ = 0;
            auVar99 = vfmadd213ps_fma(auVar129,local_1340,auVar96);
            auVar99 = vfmadd213ps_fma(local_1880,local_1360,ZEXT1632(auVar99));
            auVar97 = ZEXT1632(CONCAT412(auVar99._12_4_ + auVar99._12_4_,
                                         CONCAT48(auVar99._8_4_ + auVar99._8_4_,
                                                  CONCAT44(auVar99._4_4_ + auVar99._4_4_,
                                                           auVar99._0_4_ + auVar99._0_4_))));
            auVar52._4_4_ = fVar119 * fVar14;
            auVar52._0_4_ = fVar114 * fVar13;
            auVar52._8_4_ = fVar120 * fVar15;
            auVar52._12_4_ = fVar121 * fVar16;
            auVar52._16_4_ = fVar122 * fVar17;
            auVar52._20_4_ = fVar123 * fVar18;
            auVar52._24_4_ = fVar124 * fVar19;
            auVar52._28_4_ = auVar100._28_4_;
            auVar99 = vfmadd213ps_fma(local_1580,local_1340,auVar52);
            auVar4 = vfmadd213ps_fma(local_1560,local_1360,ZEXT1632(auVar99));
            auVar88 = vrcpps_avx(auVar97);
            auVar155._8_4_ = 0x3f800000;
            auVar155._0_8_ = &DAT_3f8000003f800000;
            auVar155._12_4_ = 0x3f800000;
            auVar155._16_4_ = 0x3f800000;
            auVar155._20_4_ = 0x3f800000;
            auVar155._24_4_ = 0x3f800000;
            auVar155._28_4_ = 0x3f800000;
            auVar99 = vfnmadd213ps_fma(auVar88,auVar97,auVar155);
            auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar88,auVar88);
            local_12a0 = ZEXT1632(CONCAT412(auVar99._12_4_ * (auVar4._12_4_ + auVar4._12_4_),
                                            CONCAT48(auVar99._8_4_ * (auVar4._8_4_ + auVar4._8_4_),
                                                     CONCAT44(auVar99._4_4_ *
                                                              (auVar4._4_4_ + auVar4._4_4_),
                                                              auVar99._0_4_ *
                                                              (auVar4._0_4_ + auVar4._0_4_)))));
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar135._4_4_ = uVar1;
            auVar135._0_4_ = uVar1;
            auVar135._8_4_ = uVar1;
            auVar135._12_4_ = uVar1;
            auVar135._16_4_ = uVar1;
            auVar135._20_4_ = uVar1;
            auVar135._24_4_ = uVar1;
            auVar135._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar151._4_4_ = uVar1;
            auVar151._0_4_ = uVar1;
            auVar151._8_4_ = uVar1;
            auVar151._12_4_ = uVar1;
            auVar151._16_4_ = uVar1;
            auVar151._20_4_ = uVar1;
            auVar151._24_4_ = uVar1;
            auVar151._28_4_ = uVar1;
            auVar88 = vcmpps_avx(auVar135,local_12a0,2);
            auVar100 = vcmpps_avx(local_12a0,auVar151,2);
            auVar88 = vandps_avx(auVar88,auVar100);
            auVar99 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            auVar86 = vpand_avx(auVar99,auVar86);
            auVar88 = vpmovsxwd_avx2(auVar86);
            if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar88 >> 0x7f,0) == '\0') &&
                  (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar88 >> 0xbf,0) == '\0') &&
                (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar88[0x1f]) goto LAB_00671ccc;
            auVar88 = vcmpps_avx(auVar97,_DAT_02020f00,4);
            auVar99 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            auVar86 = vpand_avx(auVar86,auVar99);
            local_1300 = vpmovsxwd_avx2(auVar86);
            if ((((((((local_1300 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_1300 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_1300 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_1300 >> 0x7f,0) == '\0') &&
                  (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_1300 >> 0xbf,0) == '\0') &&
                (local_1300 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_1300[0x1f]) goto LAB_00671ccc;
            uStack_13b0 = 0;
            uStack_13ac = 0;
            uStack_13a8 = 0;
            uStack_13a4 = 0;
            local_13a0 = ZEXT1632(auVar3);
            local_1220 = local_1420;
            auVar88 = vrcpps_avx(local_1380);
            auVar113._8_4_ = 0x3f800000;
            auVar113._0_8_ = &DAT_3f8000003f800000;
            auVar113._12_4_ = 0x3f800000;
            auVar113._16_4_ = 0x3f800000;
            auVar113._20_4_ = 0x3f800000;
            auVar113._24_4_ = 0x3f800000;
            auVar113._28_4_ = 0x3f800000;
            auVar99 = vfnmadd213ps_fma(local_1380,auVar88,auVar113);
            auVar99 = vfmadd132ps_fma(ZEXT1632(auVar99),auVar88,auVar88);
            auVar105._8_4_ = 0x219392ef;
            auVar105._0_8_ = 0x219392ef219392ef;
            auVar105._12_4_ = 0x219392ef;
            auVar105._16_4_ = 0x219392ef;
            auVar105._20_4_ = 0x219392ef;
            auVar105._24_4_ = 0x219392ef;
            auVar105._28_4_ = 0x219392ef;
            auVar88 = vcmpps_avx(local_16c0,auVar105,5);
            auVar88 = vandps_avx(auVar88,ZEXT1632(auVar99));
            auVar53._4_4_ = fStack_13bc * auVar88._4_4_;
            auVar53._0_4_ = local_13c0 * auVar88._0_4_;
            auVar53._8_4_ = fStack_13b8 * auVar88._8_4_;
            auVar53._12_4_ = fStack_13b4 * auVar88._12_4_;
            auVar53._16_4_ = auVar88._16_4_ * 0.0;
            auVar53._20_4_ = auVar88._20_4_ * 0.0;
            auVar53._24_4_ = auVar88._24_4_ * 0.0;
            auVar53._28_4_ = 0;
            auVar100 = vminps_avx(auVar53,auVar113);
            auVar54._4_4_ = auVar3._4_4_ * auVar88._4_4_;
            auVar54._0_4_ = auVar3._0_4_ * auVar88._0_4_;
            auVar54._8_4_ = auVar3._8_4_ * auVar88._8_4_;
            auVar54._12_4_ = auVar3._12_4_ * auVar88._12_4_;
            auVar54._16_4_ = auVar88._16_4_ * 0.0;
            auVar54._20_4_ = auVar88._20_4_ * 0.0;
            auVar54._24_4_ = auVar88._24_4_ * 0.0;
            auVar54._28_4_ = auVar88._28_4_;
            auVar88 = vminps_avx(auVar54,auVar113);
            auVar97 = vsubps_avx(auVar113,auVar100);
            auVar27 = vsubps_avx(auVar113,auVar88);
            local_12c0 = vblendvps_avx(auVar88,auVar97,local_1420);
            local_12e0 = vblendvps_avx(auVar100,auVar27,local_1420);
            local_1260._4_4_ = (float)local_1440._4_4_ * local_1340._4_4_;
            local_1260._0_4_ = (float)local_1440._0_4_ * local_1340._0_4_;
            local_1260._8_4_ = fStack_1438 * local_1340._8_4_;
            local_1260._12_4_ = fStack_1434 * local_1340._12_4_;
            local_1260._16_4_ = fStack_1430 * local_1340._16_4_;
            local_1260._20_4_ = fStack_142c * local_1340._20_4_;
            local_1260._24_4_ = fStack_1428 * local_1340._24_4_;
            local_1260._28_4_ = local_12c0._28_4_;
            local_1240._4_4_ = (float)local_1440._4_4_ * fVar119;
            local_1240._0_4_ = (float)local_1440._0_4_ * fVar114;
            local_1240._8_4_ = fStack_1438 * fVar120;
            local_1240._12_4_ = fStack_1434 * fVar121;
            local_1240._16_4_ = fStack_1430 * fVar122;
            local_1240._20_4_ = fStack_142c * fVar123;
            local_1240._24_4_ = fStack_1428 * fVar124;
            local_1240._28_4_ = uStack_1424;
            local_1280[0] = local_1360._0_4_ * (float)local_1440._0_4_;
            local_1280[1] = local_1360._4_4_ * (float)local_1440._4_4_;
            local_1280[2] = local_1360._8_4_ * fStack_1438;
            local_1280[3] = local_1360._12_4_ * fStack_1434;
            fStack_1270 = local_1360._16_4_ * fStack_1430;
            fStack_126c = local_1360._20_4_ * fStack_142c;
            fStack_1268 = local_1360._24_4_ * fStack_1428;
            uStack_1264 = local_12e0._28_4_;
            auVar86 = vpacksswb_avx(auVar86,auVar86);
            uVar60 = (ulong)(byte)(SUB161(auVar86 >> 7,0) & 1 | (SUB161(auVar86 >> 0xf,0) & 1) << 1
                                   | (SUB161(auVar86 >> 0x17,0) & 1) << 2 |
                                   (SUB161(auVar86 >> 0x1f,0) & 1) << 3 |
                                   (SUB161(auVar86 >> 0x27,0) & 1) << 4 |
                                   (SUB161(auVar86 >> 0x2f,0) & 1) << 5 |
                                   (SUB161(auVar86 >> 0x37,0) & 1) << 6 |
                                  SUB161(auVar86 >> 0x3f,0) << 7);
            auVar130 = ZEXT3264(local_1720);
            auVar136 = ZEXT3264(local_1740);
            auVar152 = ZEXT3264(local_1760);
            auVar118 = ZEXT3264(local_16e0);
            auVar127 = ZEXT3264(local_1700);
            fStack_160c = fStack_1610;
            fStack_1608 = fStack_1610;
            fStack_1604 = fStack_1610;
            do {
              uVar61 = 0;
              for (uVar65 = uVar60; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
                uVar61 = uVar61 + 1;
              }
              uVar59 = *(uint *)((long)&local_13e0 + uVar61 * 4);
              pGVar9 = (pSVar7->geometries).items[uVar59].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                uVar60 = uVar60 ^ 1L << (uVar61 & 0x3f);
                bVar85 = true;
              }
              else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                      (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                bVar85 = false;
              }
              else {
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                uVar65 = (ulong)(uint)((int)uVar61 * 4);
                uVar2 = *(undefined4 *)(local_12e0 + uVar65);
                local_14a0._4_4_ = uVar2;
                local_14a0._0_4_ = uVar2;
                local_14a0._8_4_ = uVar2;
                local_14a0._12_4_ = uVar2;
                uVar2 = *(undefined4 *)(local_12c0 + uVar65);
                local_1490._4_4_ = uVar2;
                local_1490._0_4_ = uVar2;
                local_1490._8_4_ = uVar2;
                local_1490._12_4_ = uVar2;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_12a0 + uVar65);
                local_1850.context = context->user;
                local_1470._4_4_ = uVar59;
                local_1470._0_4_ = uVar59;
                local_1470._8_4_ = uVar59;
                local_1470._12_4_ = uVar59;
                uVar2 = *(undefined4 *)((long)&local_1400 + uVar65);
                local_1480._4_4_ = uVar2;
                local_1480._0_4_ = uVar2;
                local_1480._8_4_ = uVar2;
                local_1480._12_4_ = uVar2;
                uVar2 = *(undefined4 *)((long)local_1280 + uVar65);
                local_14d0._4_4_ = uVar2;
                local_14d0._0_4_ = uVar2;
                local_14d0._8_4_ = uVar2;
                local_14d0._12_4_ = uVar2;
                local_14c0 = *(undefined4 *)(local_1260 + uVar65);
                local_14b0 = *(undefined4 *)(local_1240 + uVar65);
                vpcmpeqd_avx2(ZEXT1632(local_1470),ZEXT1632(local_1470));
                uStack_145c = (local_1850.context)->instID[0];
                local_1460 = uStack_145c;
                uStack_1458 = uStack_145c;
                uStack_1454 = uStack_145c;
                uStack_1450 = (local_1850.context)->instPrimID[0];
                uStack_144c = uStack_1450;
                uStack_1448 = uStack_1450;
                uStack_1444 = uStack_1450;
                local_18c0 = *local_18b0;
                uStack_18b8 = local_18b0[1];
                local_1850.valid = (int *)&local_18c0;
                local_1850.geometryUserPtr = pGVar9->userPtr;
                local_1850.hit = local_14d0;
                local_1850.N = 4;
                local_1850.ray = (RTCRayN *)ray;
                uStack_14bc = local_14c0;
                uStack_14b8 = local_14c0;
                uStack_14b4 = local_14c0;
                uStack_14ac = local_14b0;
                uStack_14a8 = local_14b0;
                uStack_14a4 = local_14b0;
                if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar9->occlusionFilterN)(&local_1850);
                  auVar152 = ZEXT3264(local_1760);
                  auVar136 = ZEXT3264(local_1740);
                  auVar130 = ZEXT3264(local_1720);
                  fVar142 = local_1780;
                  fVar148 = fStack_177c;
                  fVar156 = fStack_1778;
                  fVar157 = fStack_1774;
                  fVar158 = fStack_1770;
                  fVar159 = fStack_176c;
                  fVar160 = fStack_1768;
                  fVar144 = local_17a0;
                  fVar162 = fStack_179c;
                  fVar163 = fStack_1798;
                  fVar164 = fStack_1794;
                  fVar165 = fStack_1790;
                  fVar166 = fStack_178c;
                  fVar167 = fStack_1788;
                  fVar146 = local_17c0;
                  fVar168 = fStack_17bc;
                  fVar169 = fStack_17b8;
                  fVar170 = fStack_17b4;
                  fVar171 = fStack_17b0;
                  fVar172 = fStack_17ac;
                  fVar173 = fStack_17a8;
                  fVar132 = local_17e0;
                  fVar175 = fStack_17dc;
                  fVar176 = fStack_17d8;
                  fVar177 = fStack_17d4;
                  fVar178 = fStack_17d0;
                  fVar179 = fStack_17cc;
                  fVar180 = fStack_17c8;
                  fVar138 = local_1800;
                  fVar183 = fStack_17fc;
                  fVar184 = fStack_17f8;
                  fVar185 = fStack_17f4;
                  fVar186 = fStack_17f0;
                  fVar187 = fStack_17ec;
                  fVar188 = fStack_17e8;
                  fVar140 = local_1820;
                  fVar191 = fStack_181c;
                  fVar192 = fStack_1818;
                  fVar193 = fStack_1814;
                  fVar194 = fStack_1810;
                  fVar195 = fStack_180c;
                  fVar196 = fStack_1808;
                }
                auVar86._8_8_ = uStack_18b8;
                auVar86._0_8_ = local_18c0;
                auVar118 = ZEXT3264(local_16e0);
                auVar127 = ZEXT3264(local_1700);
                if (auVar86 == (undefined1  [16])0x0) {
                  auVar86 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar86 = auVar86 ^ _DAT_01febe20;
                }
                else {
                  p_Var12 = context->args->filter;
                  if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var12)(&local_1850);
                    auVar127 = ZEXT3264(local_1700);
                    auVar118 = ZEXT3264(local_16e0);
                    auVar152 = ZEXT3264(local_1760);
                    auVar136 = ZEXT3264(local_1740);
                    auVar130 = ZEXT3264(local_1720);
                    fVar142 = local_1780;
                    fVar148 = fStack_177c;
                    fVar156 = fStack_1778;
                    fVar157 = fStack_1774;
                    fVar158 = fStack_1770;
                    fVar159 = fStack_176c;
                    fVar160 = fStack_1768;
                    fVar144 = local_17a0;
                    fVar162 = fStack_179c;
                    fVar163 = fStack_1798;
                    fVar164 = fStack_1794;
                    fVar165 = fStack_1790;
                    fVar166 = fStack_178c;
                    fVar167 = fStack_1788;
                    fVar146 = local_17c0;
                    fVar168 = fStack_17bc;
                    fVar169 = fStack_17b8;
                    fVar170 = fStack_17b4;
                    fVar171 = fStack_17b0;
                    fVar172 = fStack_17ac;
                    fVar173 = fStack_17a8;
                    fVar132 = local_17e0;
                    fVar175 = fStack_17dc;
                    fVar176 = fStack_17d8;
                    fVar177 = fStack_17d4;
                    fVar178 = fStack_17d0;
                    fVar179 = fStack_17cc;
                    fVar180 = fStack_17c8;
                    fVar138 = local_1800;
                    fVar183 = fStack_17fc;
                    fVar184 = fStack_17f8;
                    fVar185 = fStack_17f4;
                    fVar186 = fStack_17f0;
                    fVar187 = fStack_17ec;
                    fVar188 = fStack_17e8;
                    fVar140 = local_1820;
                    fVar191 = fStack_181c;
                    fVar192 = fStack_1818;
                    fVar193 = fStack_1814;
                    fVar194 = fStack_1810;
                    fVar195 = fStack_180c;
                    fVar196 = fStack_1808;
                  }
                  auVar3._8_8_ = uStack_18b8;
                  auVar3._0_8_ = local_18c0;
                  auVar3 = vpcmpeqd_avx((undefined1  [16])0x0,auVar3);
                  auVar86 = auVar3 ^ _DAT_01febe20;
                  auVar99._8_4_ = 0xff800000;
                  auVar99._0_8_ = 0xff800000ff800000;
                  auVar99._12_4_ = 0xff800000;
                  auVar3 = vblendvps_avx(auVar99,*(undefined1 (*) [16])(local_1850.ray + 0x80),
                                         auVar3);
                  *(undefined1 (*) [16])(local_1850.ray + 0x80) = auVar3;
                }
                auVar86 = vpslld_avx(auVar86,0x1f);
                bVar57 = (auVar86 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                bVar58 = (auVar86 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                bVar56 = (auVar86 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                bVar55 = -1 < auVar86[0xf];
                bVar85 = ((bVar57 && bVar58) && bVar56) && bVar55;
                if (((bVar57 && bVar58) && bVar56) && bVar55) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
                  uVar60 = uVar60 ^ 1L << (uVar61 & 0x3f);
                }
              }
              if (!bVar85) {
                uVar59 = 0;
                if (bVar84) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  uVar59 = 1;
                }
                goto LAB_00671db9;
              }
            } while (uVar60 != 0);
          }
          uVar59 = 0;
          local_18a0 = local_18a0 + 1;
          bVar84 = local_18a0 < local_18a8;
        } while (local_18a0 != local_18a8);
      }
    }
LAB_00671db9:
  } while ((uVar59 & 3) == 0);
  return local_1888 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }